

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

WebPIDecoder * WebPIDecode(uint8_t *data,size_t data_size,WebPDecoderConfig *config)

{
  VP8StatusCode VVar1;
  WebPDecBuffer *in_RDX;
  long in_RSI;
  size_t in_RDI;
  WebPBitstreamFeatures *features;
  WebPBitstreamFeatures tmp_features;
  WebPIDecoder *idec;
  size_t in_stack_ffffffffffffff98;
  WebPDecBuffer *features_00;
  WebPDecBuffer *output_buffer;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  features_00 = in_RDX;
  if (in_RDX == (WebPDecBuffer *)0x0) {
    features_00 = (WebPDecBuffer *)&stack0xffffffffffffffb0;
  }
  output_buffer = features_00;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&stack0xffffffffffffffb0,0,0x28);
  if (((local_10 == 0) || (local_18 == 0)) ||
     (VVar1 = WebPGetFeatures((uint8_t *)features_00,in_stack_ffffffffffffff98,
                              (WebPBitstreamFeatures *)0x10e9a0), VVar1 == VP8_STATUS_OK)) {
    if ((WebPDecBuffer *)local_20 == (WebPDecBuffer *)0x0) {
      local_8 = NewDecoder(output_buffer,(WebPBitstreamFeatures *)features_00);
    }
    else {
      local_8 = NewDecoder(output_buffer,(WebPBitstreamFeatures *)features_00);
    }
    if ((WebPIDecoder *)local_8 == (WebPIDecoder *)0x0) {
      local_8 = (WebPIDecoder *)0x0;
    }
    else if ((WebPDecBuffer *)local_20 != (WebPDecBuffer *)0x0) {
      (((WebPIDecoder *)local_8)->params_).options = (WebPDecoderOptions *)(local_20 + 0xa0);
    }
  }
  else {
    local_8 = (WebPIDecoder *)0x0;
  }
  return (WebPIDecoder *)local_8;
}

Assistant:

WebPIDecoder* WebPIDecode(const uint8_t* data, size_t data_size,
                          WebPDecoderConfig* config) {
  WebPIDecoder* idec;
  WebPBitstreamFeatures tmp_features;
  WebPBitstreamFeatures* const features =
      (config == NULL) ? &tmp_features : &config->input;
  memset(&tmp_features, 0, sizeof(tmp_features));

  // Parse the bitstream's features, if requested:
  if (data != NULL && data_size > 0) {
    if (WebPGetFeatures(data, data_size, features) != VP8_STATUS_OK) {
      return NULL;
    }
  }

  // Create an instance of the incremental decoder
  idec = (config != NULL) ? NewDecoder(&config->output, features)
                          : NewDecoder(NULL, features);
  if (idec == NULL) {
    return NULL;
  }
  // Finish initialization
  if (config != NULL) {
    idec->params_.options = &config->options;
  }
  return idec;
}